

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  byte *pbVar1;
  uint8 uVar2;
  int iVar3;
  uint32 uVar4;
  stbi_uc *psVar5;
  long lVar6;
  float *data;
  byte *pbVar7;
  byte bVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  stbi_loader **ppsVar13;
  jpeg j;
  jpeg local_3740;
  
  local_3740.s.img_file = (FILE *)0x0;
  pbVar7 = buffer + len;
  local_3740.marker = 0xff;
  local_3740.s.img_buffer = buffer;
  local_3740.s.img_buffer_end = pbVar7;
  uVar2 = get_marker(&local_3740);
  if (uVar2 == 0xd8) {
    local_3740.s.img_file = (FILE *)0x0;
    local_3740.s.img_buffer = buffer;
    local_3740.s.img_buffer_end = pbVar7;
    psVar5 = load_jpeg_image(&local_3740,x,y,comp,req_comp);
  }
  else {
    failure_reason = "Corrupt JPEG";
    lVar6 = 0;
    pbVar12 = buffer;
    do {
      if (pbVar12 < pbVar7) {
        bVar8 = *pbVar12;
        pbVar12 = pbVar12 + 1;
      }
      else {
        bVar8 = 0;
      }
      pbVar1 = &check_png_header_png_sig + lVar6;
      if (bVar8 != *pbVar1) {
        failure_reason = "Not a PNG";
        break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    if (bVar8 == *pbVar1) {
      local_3740.s.img_file = (FILE *)0x0;
      local_3740.s.img_buffer = buffer;
      local_3740.s.img_buffer_end = pbVar7;
      psVar5 = do_png((png *)&local_3740,x,y,comp,req_comp);
    }
    else {
      local_3740.s.img_file = (FILE *)0x0;
      local_3740.s.img_buffer = buffer;
      local_3740.s.img_buffer_end = pbVar7;
      iVar3 = bmp_test(&local_3740.s);
      if (iVar3 == 0) {
        local_3740.s.img_file = (FILE *)0x0;
        local_3740.s.img_buffer = buffer;
        local_3740.s.img_buffer_end = pbVar7;
        uVar4 = get32(&local_3740.s);
        if (uVar4 == 0x38425053) {
          local_3740.s.img_file = (FILE *)0x0;
          local_3740.s.img_buffer = buffer;
          local_3740.s.img_buffer_end = pbVar7;
          psVar5 = psd_load(&local_3740.s,x,y,comp,req_comp);
        }
        else {
          local_3740.s.img_file = (FILE *)0x0;
          local_3740.s.img_buffer = buffer;
          local_3740.s.img_buffer_end = pbVar7;
          iVar3 = dds_test(&local_3740.s);
          if (iVar3 == 0) {
            cVar9 = '#';
            lVar6 = 1;
            pbVar12 = buffer;
            do {
              uVar10 = 0;
              if (pbVar12 < pbVar7) {
                uVar10 = (uint)*pbVar12;
                pbVar12 = pbVar12 + 1;
              }
              uVar11 = (uint)cVar9;
              if (uVar10 != uVar11) goto LAB_00154d59;
              cVar9 = "#?RADIANCE\n"[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0xc);
            if (uVar10 == uVar11) {
              local_3740.s.img_file = (FILE *)0x0;
              local_3740.s.img_buffer = buffer;
              local_3740.s.img_buffer_end = pbVar7;
              data = hdr_load(&local_3740.s,x,y,comp,req_comp);
              if (req_comp == 0) {
                req_comp = *comp;
              }
              psVar5 = hdr_to_ldr(data,*x,*y,req_comp);
              return psVar5;
            }
LAB_00154d59:
            if (0 < max_loaders) {
              ppsVar13 = loaders;
              lVar6 = 0;
              do {
                iVar3 = (*(*ppsVar13)->test_memory)(buffer,len);
                if (iVar3 != 0) {
                  psVar5 = (*(*ppsVar13)->load_from_memory)(buffer,len,x,y,comp,req_comp);
                  return psVar5;
                }
                lVar6 = lVar6 + 1;
                ppsVar13 = ppsVar13 + 1;
              } while (lVar6 < max_loaders);
            }
            local_3740.s.img_file = (FILE *)0x0;
            local_3740.s.img_buffer = buffer;
            local_3740.s.img_buffer_end = pbVar7;
            iVar3 = tga_test(&local_3740.s);
            if (iVar3 == 0) {
              failure_reason = "Image not of any known type, or corrupt";
              psVar5 = (stbi_uc *)0x0;
            }
            else {
              local_3740.s.img_file = (FILE *)0x0;
              local_3740.s.img_buffer = buffer;
              local_3740.s.img_buffer_end = pbVar7;
              psVar5 = tga_load(&local_3740.s,x,y,comp,req_comp);
            }
          }
          else {
            local_3740.s.img_file = (FILE *)0x0;
            local_3740.s.img_buffer = buffer;
            local_3740.s.img_buffer_end = pbVar7;
            psVar5 = dds_load(&local_3740.s,x,y,comp,req_comp);
          }
        }
      }
      else {
        local_3740.s.img_file = (FILE *)0x0;
        local_3740.s.img_buffer = buffer;
        local_3740.s.img_buffer_end = pbVar7;
        psVar5 = bmp_load(&local_3740.s,x,y,comp,req_comp);
      }
    }
  }
  return psVar5;
}

Assistant:

unsigned char *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   int i;
   if (stbi_jpeg_test_memory(buffer,len))
      return stbi_jpeg_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_png_test_memory(buffer,len))
      return stbi_png_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_bmp_test_memory(buffer,len))
      return stbi_bmp_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_psd_test_memory(buffer,len))
      return stbi_psd_load_from_memory(buffer,len,x,y,comp,req_comp);
   #ifndef STBI_NO_DDS
   if (stbi_dds_test_memory(buffer,len))
      return stbi_dds_load_from_memory(buffer,len,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len)) {
      float *hdr = stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
      return hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif
   for (i=0; i < max_loaders; ++i)
      if (loaders[i]->test_memory(buffer,len))
         return loaders[i]->load_from_memory(buffer,len,x,y,comp,req_comp);
   // test tga last because it's a crappy test!
   if (stbi_tga_test_memory(buffer,len))
      return stbi_tga_load_from_memory(buffer,len,x,y,comp,req_comp);
   return epuc("unknown image type", "Image not of any known type, or corrupt");
}